

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_pin_peer_pubkey(Curl_easy *data,char *pinnedpubkey,uchar *pubkey,size_t pubkeylen)

{
  uchar uVar1;
  char *pcVar2;
  int iVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  FILE *__stream;
  ulong uVar6;
  size_t sVar7;
  uchar *puVar8;
  size_t sVar9;
  char *__haystack;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  uchar *__s2;
  long lVar13;
  char *local_48;
  uchar *pem_ptr;
  size_t encodedlen;
  
  pem_ptr = (uchar *)0x0;
  if (pinnedpubkey == (char *)0x0) {
    return CURLE_OK;
  }
  if (pubkeylen == 0 || pubkey == (uchar *)0x0) {
    return CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  iVar3 = strncmp(pinnedpubkey,"sha256//",8);
  if (iVar3 == 0) {
    if (Curl_ssl->sha256sum == (_func_CURLcode_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
      return CURLE_SSL_PINNEDPUBKEYNOTMATCH;
    }
    puVar8 = (uchar *)(*Curl_cmalloc)(0x20);
    if (puVar8 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = (*Curl_ssl->sha256sum)(pubkey,pubkeylen,puVar8,0x20);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_base64_encode(data,(char *)puVar8,0x20,&local_48,&encodedlen);
    (*Curl_cfree)(puVar8);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    Curl_infof(data,"\t public key hash: sha256//%s\n",local_48);
    sVar9 = strlen(pinnedpubkey);
    pcVar10 = (char *)(*Curl_cmalloc)(sVar9 + 1);
    if (pcVar10 == (char *)0x0) {
      (*Curl_cfree)(local_48);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pcVar10,pinnedpubkey,sVar9 + 1);
    pcVar11 = pcVar10;
    do {
      __haystack = strstr(pcVar11,";sha256//");
      sVar7 = encodedlen;
      if (__haystack != (char *)0x0) {
        *__haystack = '\0';
      }
      sVar9 = strlen(pcVar11 + 8);
      pcVar2 = local_48;
      if (sVar7 == sVar9) {
        iVar3 = bcmp(local_48,pcVar11 + 8,sVar7);
        if ((__haystack == (char *)0x0) || (iVar3 == 0)) {
          CVar4 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          local_48 = pcVar2;
          if (iVar3 == 0) {
            CVar4 = CURLE_OK;
          }
          goto LAB_0014a5e9;
        }
      }
      else if (__haystack == (char *)0x0) break;
      *__haystack = ';';
      pcVar11 = strstr(__haystack,"sha256//");
    } while (pcVar11 != (char *)0x0);
    CVar4 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
LAB_0014a5e9:
    (*Curl_cfree)(local_48);
    local_48 = (char *)0x0;
    (*Curl_cfree)(pcVar10);
    return CVar4;
  }
  __stream = fopen64(pinnedpubkey,"rb");
  if (__stream == (FILE *)0x0) {
    return CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  puVar8 = (uchar *)0x0;
  iVar3 = fseek(__stream,0,2);
  CVar4 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  if (iVar3 == 0) {
    uVar6 = ftell(__stream);
    puVar8 = (uchar *)0x0;
    iVar3 = fseek(__stream,0,0);
    if ((uVar6 < 0x100001) && (iVar3 == 0)) {
      sVar7 = curlx_sotouz(uVar6);
      if ((sVar7 < pubkeylen) ||
         (puVar8 = (uchar *)(*Curl_cmalloc)(sVar7 + 1), puVar8 == (uchar *)0x0)) {
        puVar8 = (uchar *)0x0;
      }
      else {
        sVar9 = fread(puVar8,sVar7,1,__stream);
        if ((int)sVar9 == 1) {
          __s2 = puVar8;
          if (sVar7 != pubkeylen) {
            puVar8[sVar7] = '\0';
            pcVar10 = strstr((char *)puVar8,"-----BEGIN PUBLIC KEY-----");
            if ((pcVar10 == (char *)0x0) ||
               (((lVar12 = (long)pcVar10 - (long)puVar8, lVar12 != 0 &&
                 (puVar8[lVar12 + -1] != '\n')) ||
                (pcVar10 = strstr((char *)(puVar8 + lVar12 + 0x1a),"\n-----END PUBLIC KEY-----"),
                pcVar10 == (char *)0x0)))) goto LAB_0014a2f0;
            pcVar11 = (char *)(*Curl_cmalloc)((((long)pcVar10 - (long)puVar8) - lVar12) - 0x19);
            if (pcVar11 == (char *)0x0) goto LAB_0014a2f0;
            lVar13 = 0;
            for (uVar6 = lVar12 + 0x1a; uVar6 < (ulong)((long)pcVar10 - (long)puVar8);
                uVar6 = uVar6 + 1) {
              uVar1 = puVar8[uVar6];
              if ((uVar1 != '\n') && (uVar1 != '\r')) {
                pcVar11[lVar13] = uVar1;
                lVar13 = lVar13 + 1;
              }
            }
            pcVar11[lVar13] = '\0';
            CVar5 = Curl_base64_decode(pcVar11,&pem_ptr,&encodedlen);
            (*Curl_cfree)(pcVar11);
            if ((CVar5 != CURLE_OK) || (__s2 = pem_ptr, encodedlen != pubkeylen)) goto LAB_0014a2f0;
          }
          iVar3 = bcmp(pubkey,__s2,pubkeylen);
          CVar4 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          if (iVar3 == 0) {
            CVar4 = CURLE_OK;
          }
        }
      }
    }
  }
LAB_0014a2f0:
  (*Curl_cfree)(puVar8);
  (*Curl_cfree)(pem_ptr);
  pem_ptr = (uchar *)0x0;
  fclose(__stream);
  return CVar4;
}

Assistant:

CURLcode Curl_pin_peer_pubkey(struct Curl_easy *data,
                              const char *pinnedpubkey,
                              const unsigned char *pubkey, size_t pubkeylen)
{
  FILE *fp;
  unsigned char *buf = NULL, *pem_ptr = NULL;
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;

  /* if a path wasn't specified, don't pin */
  if(!pinnedpubkey)
    return CURLE_OK;
  if(!pubkey || !pubkeylen)
    return result;

  /* only do this if pinnedpubkey starts with "sha256//", length 8 */
  if(strncmp(pinnedpubkey, "sha256//", 8) == 0) {
    CURLcode encode;
    size_t encodedlen, pinkeylen;
    char *encoded, *pinkeycopy, *begin_pos, *end_pos;
    unsigned char *sha256sumdigest;

    if(!Curl_ssl->sha256sum) {
      /* without sha256 support, this cannot match */
      return result;
    }

    /* compute sha256sum of public key */
    sha256sumdigest = malloc(CURL_SHA256_DIGEST_LENGTH);
    if(!sha256sumdigest)
      return CURLE_OUT_OF_MEMORY;
    encode = Curl_ssl->sha256sum(pubkey, pubkeylen,
                        sha256sumdigest, CURL_SHA256_DIGEST_LENGTH);

    if(encode != CURLE_OK)
      return encode;

    encode = Curl_base64_encode(data, (char *)sha256sumdigest,
                                CURL_SHA256_DIGEST_LENGTH, &encoded,
                                &encodedlen);
    Curl_safefree(sha256sumdigest);

    if(encode)
      return encode;

    infof(data, "\t public key hash: sha256//%s\n", encoded);

    /* it starts with sha256//, copy so we can modify it */
    pinkeylen = strlen(pinnedpubkey) + 1;
    pinkeycopy = malloc(pinkeylen);
    if(!pinkeycopy) {
      Curl_safefree(encoded);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pinkeycopy, pinnedpubkey, pinkeylen);
    /* point begin_pos to the copy, and start extracting keys */
    begin_pos = pinkeycopy;
    do {
      end_pos = strstr(begin_pos, ";sha256//");
      /*
       * if there is an end_pos, null terminate,
       * otherwise it'll go to the end of the original string
       */
      if(end_pos)
        end_pos[0] = '\0';

      /* compare base64 sha256 digests, 8 is the length of "sha256//" */
      if(encodedlen == strlen(begin_pos + 8) &&
         !memcmp(encoded, begin_pos + 8, encodedlen)) {
        result = CURLE_OK;
        break;
      }

      /*
       * change back the null-terminator we changed earlier,
       * and look for next begin
       */
      if(end_pos) {
        end_pos[0] = ';';
        begin_pos = strstr(end_pos, "sha256//");
      }
    } while(end_pos && begin_pos);
    Curl_safefree(encoded);
    Curl_safefree(pinkeycopy);
    return result;
  }

  fp = fopen(pinnedpubkey, "rb");
  if(!fp)
    return result;

  do {
    long filesize;
    size_t size, pem_len;
    CURLcode pem_read;

    /* Determine the file's size */
    if(fseek(fp, 0, SEEK_END))
      break;
    filesize = ftell(fp);
    if(fseek(fp, 0, SEEK_SET))
      break;
    if(filesize < 0 || filesize > MAX_PINNED_PUBKEY_SIZE)
      break;

    /*
     * if the size of our certificate is bigger than the file
     * size then it can't match
     */
    size = curlx_sotouz((curl_off_t) filesize);
    if(pubkeylen > size)
      break;

    /*
     * Allocate buffer for the pinned key
     * With 1 additional byte for null terminator in case of PEM key
     */
    buf = malloc(size + 1);
    if(!buf)
      break;

    /* Returns number of elements read, which should be 1 */
    if((int) fread(buf, size, 1, fp) != 1)
      break;

    /* If the sizes are the same, it can't be base64 encoded, must be der */
    if(pubkeylen == size) {
      if(!memcmp(pubkey, buf, pubkeylen))
        result = CURLE_OK;
      break;
    }

    /*
     * Otherwise we will assume it's PEM and try to decode it
     * after placing null terminator
     */
    buf[size] = '\0';
    pem_read = pubkey_pem_to_der((const char *)buf, &pem_ptr, &pem_len);
    /* if it wasn't read successfully, exit */
    if(pem_read)
      break;

    /*
     * if the size of our certificate doesn't match the size of
     * the decoded file, they can't be the same, otherwise compare
     */
    if(pubkeylen == pem_len && !memcmp(pubkey, pem_ptr, pubkeylen))
      result = CURLE_OK;
  } while(0);

  Curl_safefree(buf);
  Curl_safefree(pem_ptr);
  fclose(fp);

  return result;
}